

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Throw.cpp
# Opt level: O2

bool Js::Throw::ReportAssert(LPCSTR fileName,uint lineNumber,LPCSTR error,LPCSTR message)

{
  code *pcVar1;
  bool bVar2;
  DWORD DVar3;
  PAL_FILE *pPVar4;
  
  bVar2 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)Configuration::Global,AssertBreakFlag);
  if (!bVar2) {
    bVar2 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)Configuration::Global,AssertIgnoreFlag);
    if ((!bVar2) && (AssertsToConsole != 0)) {
      pPVar4 = PAL_get_stderr(0);
      DVar3 = GetCurrentProcessId();
      PAL_fprintf(pPVar4,"ASSERTION %u: (%s, line %u) %s\n Failure: %s\n",(ulong)DVar3,fileName,
                  (ulong)lineNumber,message,error);
      pPVar4 = PAL_get_stderr(0);
      PAL_fflush(pPVar4);
    }
    return bVar2;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

bool Throw::ReportAssert(__in LPCSTR fileName, uint lineNumber, __in LPCSTR error, __in LPCSTR message)
    {
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.IsEnabled(Js::AssertBreakFlag))
        {
            DebugBreak();
            return false;
        }
        if (Js::Configuration::Global.flags.IsEnabled(Js::AssertIgnoreFlag))
        {
            return true;
        }
#endif
        if (AssertsToConsole)
        {
            fprintf(stderr, "ASSERTION %u: (%s, line %u) %s\n Failure: %s\n", GetCurrentProcessId(), fileName, lineNumber, message, error);
            fflush(stderr);
#ifdef GENERATE_DUMP
            // force dump if we have assert in jc.exe. check build only.
            if (!Js::Configuration::Global.flags.IsEnabled(Js::DumpOnCrashFlag))
            {
                return false;
            }
            Throw::GenerateDumpForAssert(Js::Configuration::Global.flags.DumpOnCrash);
#else
            return false;
#endif
        }

        // The following code is applicable only when we are hosted in an
        // GUI environment
#if defined(ENABLE_DEBUG_CONFIG_OPTIONS) && defined(_WIN32)
        // Then if DumpOncrashFlag is not specified it directly returns,
        // otherwise if will raise a non-continuable exception, generate the dump and terminate the process.
        // the popup message box might be useful when testing in IE
        if (Js::Configuration::Global.flags.AssertPopUp && IsMessageBoxWPresent())
        {
            char16 buff[1024];

            swprintf_s(buff, _countof(buff), _u("%S (%u)\n%S\n%S"), fileName, lineNumber, message, error);
            buff[_countof(buff)-1] = 0;

            int ret = MessageBox(nullptr, buff, CHAKRA_ASSERT_CAPTION, MB_ABORTRETRYIGNORE);

            switch (ret)
            {
            case IDIGNORE:
                return true;
            case IDABORT:
                Throw::FatalInternalError();
            default:
                return false;
            }
        }
#endif
        return false;
    }